

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3HaltConstraint(Parse *pParse,int errCode,int onError,char *p4,i8 p4type,u8 p5Errmsg)

{
  int addr;
  Vdbe *p;
  Parse *pPVar1;
  
  p = pParse->pVdbe;
  if (p == (Vdbe *)0x0) {
    p = allocVdbe(pParse);
  }
  if (onError == 2) {
    pPVar1 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar1 = pParse;
    }
    pPVar1->mayAbort = '\x01';
    onError = 2;
  }
  addr = sqlite3VdbeAddOp3(p,0x37,errCode,onError,0);
  sqlite3VdbeChangeP4(p,addr,p4,(int)p4type);
  if (0 < (long)p->nOp) {
    p->aOp[(long)p->nOp + -1].p5 = (ushort)p5Errmsg;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3HaltConstraint(
  Parse *pParse,    /* Parsing context */
  int errCode,      /* extended error code */
  int onError,      /* Constraint type */
  char *p4,         /* Error message */
  i8 p4type,        /* P4_STATIC or P4_TRANSIENT */
  u8 p5Errmsg       /* P5_ErrMsg type */
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  assert( (errCode&0xff)==SQLITE_CONSTRAINT );
  if( onError==OE_Abort ){
    sqlite3MayAbort(pParse);
  }
  sqlite3VdbeAddOp4(v, OP_Halt, errCode, onError, 0, p4, p4type);
  sqlite3VdbeChangeP5(v, p5Errmsg);
}